

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_2> * tcu::operator+(Matrix<float,_4,_2> *a,Matrix<float,_4,_2> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector<float,_4> *pVVar7;
  Matrix<float,_4,_2> *res;
  Matrix<float,_4,_2> *in_RDI;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 1.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[3] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[1] = 1.0;
  pVVar7 = (in_RDI->m_data).m_data;
  pVVar7[1].m_data[2] = 0.0;
  pVVar7[1].m_data[3] = 0.0;
  fVar1 = (a->m_data).m_data[0].m_data[1];
  fVar2 = (a->m_data).m_data[0].m_data[2];
  fVar3 = (a->m_data).m_data[0].m_data[3];
  fVar4 = (b->m_data).m_data[0].m_data[1];
  fVar5 = (b->m_data).m_data[0].m_data[2];
  fVar6 = (b->m_data).m_data[0].m_data[3];
  (in_RDI->m_data).m_data[0].m_data[0] =
       (b->m_data).m_data[0].m_data[0] + (a->m_data).m_data[0].m_data[0];
  (in_RDI->m_data).m_data[0].m_data[1] = fVar4 + fVar1;
  (in_RDI->m_data).m_data[0].m_data[2] = fVar5 + fVar2;
  (in_RDI->m_data).m_data[0].m_data[3] = fVar6 + fVar3;
  fVar1 = (a->m_data).m_data[1].m_data[1];
  fVar2 = (a->m_data).m_data[1].m_data[2];
  fVar3 = (a->m_data).m_data[1].m_data[3];
  fVar4 = (b->m_data).m_data[1].m_data[1];
  fVar5 = (b->m_data).m_data[1].m_data[2];
  fVar6 = (b->m_data).m_data[1].m_data[3];
  (in_RDI->m_data).m_data[1].m_data[0] =
       (b->m_data).m_data[1].m_data[0] + (a->m_data).m_data[1].m_data[0];
  (in_RDI->m_data).m_data[1].m_data[1] = fVar4 + fVar1;
  (in_RDI->m_data).m_data[1].m_data[2] = fVar5 + fVar2;
  (in_RDI->m_data).m_data[1].m_data[3] = fVar6 + fVar3;
  return in_RDI;
}

Assistant:

Matrix<T, Rows, Cols> operator+ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) + b(row, col);
	return res;
}